

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Matchers::HasSizeMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,HasSizeMatcher *this)

{
  ReusableStringStream sstr;
  ReusableStringStream RStack_28;
  
  ReusableStringStream::ReusableStringStream(&RStack_28);
  std::operator<<(RStack_28.m_oss,"has size == ");
  ReusableStringStream::operator<<(&RStack_28,&this->m_target_size);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string HasSizeMatcher::describe() const {
        ReusableStringStream sstr;
        sstr << "has size == " << m_target_size;
        return sstr.str();
    }